

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

void __thiscall Fl_Preferences::Node::set(Node *this,char *name,char *value)

{
  int iVar1;
  char *pcVar2;
  Entry *pEVar3;
  char *local_40;
  int local_34;
  int local_24;
  int i;
  char *value_local;
  char *name_local;
  Node *this_local;
  
  local_24 = 0;
  while( true ) {
    if (this->nEntry_ <= local_24) {
      if (this->NEntry_ == this->nEntry_) {
        if (this->NEntry_ == 0) {
          local_34 = 10;
        }
        else {
          local_34 = this->NEntry_ << 1;
        }
        this->NEntry_ = local_34;
        pEVar3 = (Entry *)realloc(this->entry_,(long)this->NEntry_ << 4);
        this->entry_ = pEVar3;
      }
      pcVar2 = strdup(name);
      this->entry_[this->nEntry_].name = pcVar2;
      if (value == (char *)0x0) {
        local_40 = (char *)0x0;
      }
      else {
        local_40 = strdup(value);
      }
      this->entry_[this->nEntry_].value = local_40;
      lastEntrySet = this->nEntry_;
      this->nEntry_ = this->nEntry_ + 1;
      this->field_0x30 = this->field_0x30 & 0xfe | 1;
      return;
    }
    iVar1 = strcmp(name,this->entry_[local_24].name);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  if (value == (char *)0x0) {
    return;
  }
  iVar1 = strcmp(value,this->entry_[local_24].value);
  if (iVar1 != 0) {
    if (this->entry_[local_24].value != (char *)0x0) {
      free(this->entry_[local_24].value);
    }
    pcVar2 = strdup(value);
    this->entry_[local_24].value = pcVar2;
    this->field_0x30 = this->field_0x30 & 0xfe | 1;
  }
  lastEntrySet = local_24;
  return;
}

Assistant:

void Fl_Preferences::Node::set( const char *name, const char *value )
{
  for ( int i=0; i<nEntry_; i++ ) {
    if ( strcmp( name, entry_[i].name ) == 0 ) {
      if ( !value ) return; // annotation
      if ( strcmp( value, entry_[i].value ) != 0 ) {
	if ( entry_[i].value )
	  free( entry_[i].value );
	entry_[i].value = strdup( value );
	dirty_ = 1;
      }
      lastEntrySet = i;
      return;
    }
  }
  if ( NEntry_==nEntry_ ) {
    NEntry_ = NEntry_ ? NEntry_*2 : 10;
    entry_ = (Entry*)realloc( entry_, NEntry_ * sizeof(Entry) );
  }
  entry_[ nEntry_ ].name = strdup( name );
  entry_[ nEntry_ ].value = value?strdup( value ):0;
  lastEntrySet = nEntry_;
  nEntry_++;
  dirty_ = 1;
}